

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O0

void __thiscall Rml::ElementHandleTargetData::SetDefiniteMargins(ElementHandleTargetData *this)

{
  LengthPercentageAuto LVar1;
  Type local_34;
  Type local_2c;
  Type local_24;
  Type local_1c;
  anon_class_1_0_00000001 local_11;
  ElementHandleTargetData *pEStack_10;
  anon_class_1_0_00000001 SetDefiniteMargin;
  ElementHandleTargetData *this_local;
  
  pEStack_10 = this;
  LVar1 = Style::ComputedValues::margin_top(this->computed);
  local_1c = LVar1.type;
  if (local_1c == Auto) {
    SetDefiniteMargins::anon_class_1_0_00000001::operator()(&local_11,this->target,MarginTop,Top);
  }
  LVar1 = Style::ComputedValues::margin_right(this->computed);
  local_24 = LVar1.type;
  if (local_24 == Auto) {
    SetDefiniteMargins::anon_class_1_0_00000001::operator()
              (&local_11,this->target,MarginRight,Right);
  }
  LVar1 = Style::ComputedValues::margin_bottom(this->computed);
  local_2c = LVar1.type;
  if (local_2c == Auto) {
    SetDefiniteMargins::anon_class_1_0_00000001::operator()
              (&local_11,this->target,MarginBottom,Bottom);
  }
  LVar1 = Style::ComputedValues::margin_left(this->computed);
  local_34 = LVar1.type;
  if (local_34 == Auto) {
    SetDefiniteMargins::anon_class_1_0_00000001::operator()(&local_11,this->target,MarginLeft,Left);
  }
  return;
}

Assistant:

void SetDefiniteMargins()
	{
		// Set any auto margins to their current value, since auto-margins may affect the size and position of an element.
		auto SetDefiniteMargin = [](Element* element, PropertyId margin_id, BoxEdge edge) {
			element->SetProperty(margin_id, Property(Math::Round(element->GetBox().GetEdge(BoxArea::Margin, edge)), Unit::PX));
		};
		using Style::Margin;
		if (computed.margin_top().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginTop, BoxEdge::Top);
		if (computed.margin_right().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginRight, BoxEdge::Right);
		if (computed.margin_bottom().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginBottom, BoxEdge::Bottom);
		if (computed.margin_left().type == Margin::Auto)
			SetDefiniteMargin(target, PropertyId::MarginLeft, BoxEdge::Left);
	}